

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

void InverseMoveToFrontTransform(uint8_t *v,uint32_t v_len,BrotliDecoderStateInternal *state)

{
  uint8_t *__src;
  byte bVar1;
  uint8_t uVar2;
  uint32_t uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar12;
  undefined1 auVar11 [16];
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  
  uVar3 = state->mtf_upper_bound;
  state->mtf[1] = 0x3020100;
  auVar6 = _DAT_001080e0;
  auVar5 = _DAT_001080d0;
  auVar4 = _DAT_001080c0;
  uVar9 = (ulong)(uVar3 + (uVar3 == 0));
  lVar7 = uVar9 - 1;
  auVar11._8_4_ = (int)lVar7;
  auVar11._0_8_ = lVar7;
  auVar11._12_4_ = (int)((ulong)lVar7 >> 0x20);
  iVar13 = 0x3020100;
  iVar14 = 0x7060504;
  iVar15 = 0xb0a0908;
  iVar16 = 0xf0e0d0c;
  uVar8 = 0;
  auVar11 = auVar11 ^ _DAT_001080e0;
  do {
    auVar18._8_4_ = (int)uVar8;
    auVar18._0_8_ = uVar8;
    auVar18._12_4_ = (int)(uVar8 >> 0x20);
    auVar17 = (auVar18 | auVar5) ^ auVar6;
    iVar12 = auVar11._4_4_;
    if ((bool)(~(auVar17._4_4_ == iVar12 && auVar11._0_4_ < auVar17._0_4_ || iVar12 < auVar17._4_4_)
              & 1)) {
      state->mtf[uVar8 + 2] = iVar13 + 0x4040404;
    }
    if ((auVar17._12_4_ != auVar11._12_4_ || auVar17._8_4_ <= auVar11._8_4_) &&
        auVar17._12_4_ <= auVar11._12_4_) {
      state->mtf[uVar8 + 3] = iVar14 + 0x4040404;
    }
    auVar17 = (auVar18 | auVar4) ^ auVar6;
    iVar19 = auVar17._4_4_;
    if (iVar19 <= iVar12 && (iVar19 != iVar12 || auVar17._0_4_ <= auVar11._0_4_)) {
      state->mtf[uVar8 + 4] = iVar15 + 0x4040404;
      state->mtf[uVar8 + 5] = iVar16 + 0x4040404;
    }
    uVar8 = uVar8 + 4;
    iVar13 = iVar13 + 0x10101010;
    iVar14 = iVar14 + 0x10101010;
    iVar15 = iVar15 + 0x10101010;
    iVar16 = iVar16 + 0x10101010;
  } while ((uVar9 + 3 & 0xfffffffffffffffc) != uVar8);
  __src = (uint8_t *)((long)state->mtf + 3);
  uVar10 = 0;
  for (uVar9 = 0; v_len != uVar9; uVar9 = uVar9 + 1) {
    bVar1 = v[uVar9];
    uVar2 = *(uint8_t *)((long)(state->mtf + 1) + (ulong)bVar1);
    v[uVar9] = uVar2;
    *__src = uVar2;
    memmove(state->mtf + 1,__src,(ulong)bVar1 + 1);
    uVar10 = uVar10 | bVar1;
  }
  state->mtf_upper_bound = uVar10 >> 2;
  return;
}

Assistant:

static BROTLI_NOINLINE void InverseMoveToFrontTransform(
    uint8_t* v, uint32_t v_len, BrotliDecoderState* state) {
  /* Reinitialize elements that could have been changed. */
  uint32_t i = 1;
  uint32_t upper_bound = state->mtf_upper_bound;
  uint32_t* mtf = &state->mtf[1];  /* Make mtf[-1] addressable. */
  uint8_t* mtf_u8 = (uint8_t*)mtf;
  /* Load endian-aware constant. */
  const uint8_t b0123[4] = {0, 1, 2, 3};
  uint32_t pattern;
  memcpy(&pattern, &b0123, 4);

  /* Initialize list using 4 consequent values pattern. */
  mtf[0] = pattern;
  do {
    pattern += 0x04040404;  /* Advance all 4 values by 4. */
    mtf[i] = pattern;
    i++;
  } while (i <= upper_bound);

  /* Transform the input. */
  upper_bound = 0;
  for (i = 0; i < v_len; ++i) {
    int index = v[i];
    uint8_t value = mtf_u8[index];
    upper_bound |= v[i];
    v[i] = value;
    mtf_u8[-1] = value;
    do {
      index--;
      mtf_u8[index + 1] = mtf_u8[index];
    } while (index >= 0);
  }
  /* Remember amount of elements to be reinitialized. */
  state->mtf_upper_bound = upper_bound >> 2;
}